

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score_function.h
# Opt level: O0

void __thiscall xLearn::Score::~Score(Score *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Score_002c3158;
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  return;
}

Assistant:

virtual ~Score() { }